

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptLibrary.cpp
# Opt level: O2

bool Js::JavascriptLibrary::InitializeSharedArrayBufferPrototype
               (DynamicObject *sharedArrayBufferPrototype,DeferredTypeHandlerBase *typeHandler,
               DeferredInitializeMode mode)

{
  JavascriptLibrary *this;
  ScriptContext *pSVar1;
  JavascriptString *pJVar2;
  
  DeferredTypeHandlerBase::Convert(typeHandler,sharedArrayBufferPrototype,mode,4,0);
  this = (((sharedArrayBufferPrototype->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr;
  pSVar1 = (this->super_JavascriptLibraryBase).scriptContext.ptr;
  (*(sharedArrayBufferPrototype->super_RecyclableObject).super_FinalizableObject.
    super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
            (sharedArrayBufferPrototype,0x67,(this->sharedArrayBufferConstructor).ptr,6,0,0,0);
  AddFunctionToLibraryObject
            (this,sharedArrayBufferPrototype,0x150,
             (FunctionInfo *)SharedArrayBuffer::EntryInfo::Slice,2,'\x06');
  AddAccessorsToLibraryObject
            (this,sharedArrayBufferPrototype,0x1a9,
             (FunctionInfo *)SharedArrayBuffer::EntryInfo::GetterByteLength,(FunctionInfo *)0x0);
  if (((pSVar1->config).threadConfig)->m_ES6ToStringTag == true) {
    pJVar2 = CreateStringFromCppLiteral<18ul>(this,(char16 (*) [18])0xffec1e);
    (*(sharedArrayBufferPrototype->super_RecyclableObject).super_FinalizableObject.
      super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject[0x1e])
              (sharedArrayBufferPrototype,0x1b,pJVar2,2,0,0,0);
  }
  DynamicObject::SetHasNoEnumerableProperties(sharedArrayBufferPrototype,true);
  return true;
}

Assistant:

bool JavascriptLibrary::InitializeSharedArrayBufferPrototype(DynamicObject* sharedArrayBufferPrototype, DeferredTypeHandlerBase * typeHandler, DeferredInitializeMode mode)
    {
        typeHandler->Convert(sharedArrayBufferPrototype, mode, 4);

        ScriptContext* scriptContext = sharedArrayBufferPrototype->GetScriptContext();
        JavascriptLibrary* library = sharedArrayBufferPrototype->GetLibrary();
        library->AddMember(sharedArrayBufferPrototype, PropertyIds::constructor, library->sharedArrayBufferConstructor);
        library->AddFunctionToLibraryObject(sharedArrayBufferPrototype, PropertyIds::slice, &SharedArrayBuffer::EntryInfo::Slice, 2);
        library->AddAccessorsToLibraryObject(sharedArrayBufferPrototype, PropertyIds::byteLength, &SharedArrayBuffer::EntryInfo::GetterByteLength, nullptr);

        if (scriptContext->GetConfig()->IsES6ToStringTagEnabled())
        {
            library->AddMember(sharedArrayBufferPrototype, PropertyIds::_symbolToStringTag, library->CreateStringFromCppLiteral(_u("SharedArrayBuffer")), PropertyConfigurable);
        }

        sharedArrayBufferPrototype->SetHasNoEnumerableProperties(true);

        return true;
    }